

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O3

Vec3 OpenSteer::randomVectorOnUnitRadiusXZDisk(void)

{
  int iVar1;
  float fVar2;
  Vec3 VVar3;
  
  do {
    iVar1 = rand();
    fVar2 = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
    iVar1 = rand();
    VVar3.z = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
  } while (1.0 <= SQRT(VVar3.z * VVar3.z + fVar2 * fVar2 + 0.0));
  VVar3.y = 0.0;
  VVar3.x = fVar2;
  return VVar3;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::randomVectorOnUnitRadiusXZDisk (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               0,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}